

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int a;
  int b;
  
  b = 0;
  if (tostore != -1) {
    b = tostore;
  }
  if ((tostore != 0) && (tostore < 0x33)) {
    a = (nelems + -1) / 0x32 + 1;
    if (nelems < 0x31cf) {
      luaK_codeABC(fs,OP_SETLIST,base,b,a);
    }
    else {
      if (0x31ffffce < (uint)nelems) {
        luaX_syntaxerror(fs->ls,"constructor too long");
      }
      luaK_codeABC(fs,OP_SETLIST,base,b,0);
      codeextraarg(fs,a);
    }
    fs->freereg = (char)base + '\x01';
    return;
  }
  __assert_fail("tostore != 0 && tostore <= 50",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x6f5,"void luaK_setlist(FuncState *, int, int, int)");
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  int c =  (nelems - 1)/LFIELDS_PER_FLUSH + 1;
  int b = (tostore == LUA_MULTRET) ? 0 : tostore;
  lua_assert(tostore != 0 && tostore <= LFIELDS_PER_FLUSH);
  if (c <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, b, c);
  else if (c <= MAXARG_Ax) {
    luaK_codeABC(fs, OP_SETLIST, base, b, 0);
    codeextraarg(fs, c);
  }
  else
    luaX_syntaxerror(fs->ls, "constructor too long");
  fs->freereg = base + 1;  /* free registers with list values */
}